

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

uint Validator::constraintS6(Solution *solution)

{
  pointer ppTVar1;
  pointer ppTVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar6;
  _Rb_tree_header *p_Var7;
  Nurse *pNVar8;
  History *this;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar9;
  Scenario *this_00;
  string *psVar10;
  _Base_ptr p_Var11;
  uint uVar12;
  Contract contract;
  string local_90;
  Contract local_70;
  
  pmVar6 = Solution::getNurses_abi_cxx11_(solution);
  p_Var11 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 == p_Var7) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      pNVar8 = NurseSolution::getNurse(*(NurseSolution **)(p_Var11 + 2));
      this = Nurse::getHistory(pNVar8);
      iVar4 = History::getNumberOfAssignments(this);
      pvVar9 = NurseSolution::getTurns(*(NurseSolution **)(p_Var11 + 2));
      ppTVar1 = (pvVar9->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      ppTVar2 = (pvVar9->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      this_00 = Scenario::getInstance();
      pNVar8 = NurseSolution::getNurse(*(NurseSolution **)(p_Var11 + 2));
      psVar10 = Nurse::getContract_abi_cxx11_(pNVar8);
      pcVar3 = (psVar10->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + psVar10->_M_string_length);
      Scenario::getContract(&local_70,this_00,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      iVar5 = Contract::getMaximumNumberOfAssignments(&local_70);
      iVar4 = iVar4 + (int)((ulong)((long)ppTVar1 - (long)ppTVar2) >> 3);
      if (iVar5 < iVar4) {
        iVar5 = Contract::getMaximumNumberOfAssignments(&local_70);
        iVar4 = iVar4 - iVar5;
LAB_001148bc:
        uVar12 = uVar12 + iVar4 * 0x14;
      }
      else {
        iVar5 = Contract::getMinimumNumberOfAssignments(&local_70);
        if (iVar4 < iVar5) {
          iVar5 = Contract::getMinimumNumberOfAssignments(&local_70);
          iVar4 = iVar5 - iVar4;
          goto LAB_001148bc;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.id._M_dataplus._M_p != &local_70.id.field_2) {
        operator_delete(local_70.id._M_dataplus._M_p,local_70.id.field_2._M_allocated_capacity + 1);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var7);
  }
  return uVar12;
}

Assistant:

unsigned int Validator::constraintS6(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int totalAssignments = nurse.second->getNurse()->getHistory().getNumberOfAssignments();
        totalAssignments += nurse.second->getTurns().size();
        Contract contract = Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract());
        if(totalAssignments > contract.getMaximumNumberOfAssignments())
            sum += 20 * (totalAssignments-contract.getMaximumNumberOfAssignments());
        else if (totalAssignments < contract.getMinimumNumberOfAssignments())
            sum += 20 * (contract.getMinimumNumberOfAssignments() - totalAssignments);
    }
    return  sum;
}